

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O2

void init_descriptor(int control)

{
  bool bVar1;
  int __fd;
  int iVar2;
  DESCRIPTOR_DATA *d;
  char *pcVar3;
  int *piVar4;
  hostent *phVar5;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  size_t sStackY_1250;
  int size;
  uint local_1234;
  uint local_1230;
  uint local_122c;
  sockaddr_in sock;
  char buf [4608];
  
  size = 0x10;
  getsockname(control,(sockaddr *)&sock,(socklen_t *)&size);
  __fd = accept(control,(sockaddr *)&sock,(socklen_t *)&size);
  if (__fd < 0) {
    piVar4 = __errno_location();
    buf._0_8_ = strerror(*piVar4);
    pcVar3 = "Init_descriptor: accept: {}";
    sStackY_1250 = 0x1b;
LAB_002d27ff:
    fmt_01._M_str = pcVar3;
    fmt_01._M_len = sStackY_1250;
    CLogger::Warn<char*>((CLogger *)&RS.field_0x140,fmt_01,(char **)buf);
    return;
  }
  iVar2 = fcntl(__fd,4,0x800);
  if ((iVar2 == -1) || (iVar2 = fcntl(__fd,4,0x800), iVar2 == -1)) {
    piVar4 = __errno_location();
    buf._0_8_ = strerror(*piVar4);
    pcVar3 = "Init_descriptor: fcntl FNDELAY: {}";
    sStackY_1250 = 0x22;
    goto LAB_002d27ff;
  }
  d = new_descriptor();
  d->descriptor = (short)__fd;
  d->connected = 1;
  d->showstr_head = (char *)0x0;
  d->showstr_point = (char *)0x0;
  d->outsize = 2000;
  d->pEdit = (void *)0x0;
  d->pString = (char **)0x0;
  d->editor = 0;
  pcVar3 = (char *)operator_new__(2000);
  d->outbuf = pcVar3;
  d->outtop = 0;
  size = 0x10;
  iVar2 = getpeername(__fd,(sockaddr *)&sock,(socklen_t *)&size);
  if (iVar2 < 0) {
    piVar4 = __errno_location();
    buf._0_8_ = strerror(*piVar4);
    fmt_02._M_str = "Init_descriptor: getpeername: {}";
    fmt_02._M_len = 0x20;
    CLogger::Warn<char*>((CLogger *)&RS.field_0x140,fmt_02,(char **)buf);
    pcVar3 = palloc_string("(unknown)");
    d->host = pcVar3;
    iVar2 = (int)d->type;
  }
  else {
    local_1234 = sock.sin_addr.s_addr >> 0x18;
    buf._0_8_ = CONCAT44(buf._4_4_,sock.sin_addr.s_addr) & 0xffffffff000000ff;
    local_122c = ((sock.sin_addr.s_addr & 0xff00) << 8) >> 0x10;
    local_1230 = (sock.sin_addr.s_addr & 0xff0000) >> 0x10;
    fmt._M_str = "Sock.sinaddr:  {}.{}.{}.{}";
    fmt._M_len = 0x1a;
    CLogger::Info<int,int,int,int>
              ((CLogger *)&RS.field_0x140,fmt,(int *)buf,(int *)&local_122c,(int *)&local_1230,
               (int *)&local_1234);
    pcVar3 = strstr(buf,"204.82.56.");
    if (pcVar3 != (char *)0x0) {
      fmt_00._M_str = "DNS lookup refused. Forbidding access.";
      fmt_00._M_len = 0x26;
      CLogger::Info<>((CLogger *)&RS.field_0x140,fmt_00);
      pcVar3 = "Your site has been banned from this mud due to DNS problems.\n\r";
      goto LAB_002d28b9;
    }
    phVar5 = gethostbyaddr(&sock.sin_addr,4,2);
    if (phVar5 == (hostent *)0x0) {
      pcVar3 = palloc_string(buf);
      d->host = pcVar3;
      d->type = 1;
      iVar2 = 1;
    }
    else {
      pcVar3 = palloc_string(phVar5->h_name);
      d->host = pcVar3;
      d->type = 0;
      iVar2 = 0;
    }
  }
  bVar1 = check_ban(pcVar3,0,iVar2);
  if (!bVar1) {
    d->next = descriptor_list;
    pcVar3 = help_greeting;
    if (*help_greeting == '.') {
      pcVar3 = help_greeting + 1;
    }
    descriptor_list = d;
    write_to_buffer(d,pcVar3,0);
    return;
  }
  pcVar3 = "Your site has been banned from this mud.\n\r";
LAB_002d28b9:
  write_to_descriptor(__fd,pcVar3,0);
  close(__fd);
  free_descriptor(d);
  return;
}

Assistant:

void init_descriptor(int control)
{
	char buf[MAX_STRING_LENGTH];
	DESCRIPTOR_DATA *dnew;
	struct sockaddr_in sock;
	struct hostent *from;
	int desc;
	int size;

	size = sizeof(sock);
	getsockname(control, (struct sockaddr *)&sock, (socklen_t *)&size);

	if ((desc = accept(control, (struct sockaddr *)&sock, (socklen_t *)&size)) < 0)
	{
		RS.Logger.Warn("Init_descriptor: accept: {}", std::strerror(errno));
		return;
	}

	if (fcntl(desc, F_SETFL, FNDELAY) == -1)
	{
		RS.Logger.Warn("Init_descriptor: fcntl FNDELAY: {}", std::strerror(errno));
		return;
	}

#ifndef _WIN32  /* windows doesn't lock files like this so we should be able to bypass */
	if (fcntl(desc, F_SETFL, FNDELAY) == -1)
	{
		RS.Logger.Warn("Init_descriptor: fcntl FNDELAY: {}", std::strerror(errno));
		return;
	}
#endif

	/*
	 * Cons a new descriptor.
	 */
	dnew = new_descriptor();
	dnew->descriptor = desc;
	dnew->connected = CON_GET_NAME;
	dnew->showstr_head = nullptr;
	dnew->showstr_point = nullptr;
	dnew->outsize = 2000;
	dnew->pEdit = nullptr;	  /* OLC */
	dnew->pString = nullptr; /* OLC */
	dnew->editor = 0;	  /* OLC */
	dnew->outbuf = new char[dnew->outsize];
	dnew->outtop = 0;

	size = sizeof(sock);

	if (getpeername(desc, (struct sockaddr *)&sock, (socklen_t *)&size) < 0)
	{
		RS.Logger.Warn("Init_descriptor: getpeername: {}", std::strerror(errno));
		dnew->host = palloc_string("(unknown)");
	}
	else
	{
		/*
		 * Would be nice to use inet_ntoa here but it takes a struct arg,
		 * which ain't very compatible between gcc and system libraries.
		 */
		int addr;

		addr = ntohl(sock.sin_addr.s_addr);

		RS.Logger.Info("Sock.sinaddr:  {}.{}.{}.{}", (addr >> 24) & 0xFF, (addr >> 16) & 0xFF, (addr >> 8) & 0xFF, (addr)&0xFF);

		if (strstr(buf, "204.82.56."))
		{
			RS.Logger.Info("DNS lookup refused. Forbidding access.");
			write_to_descriptor(desc, "Your site has been banned from this mud due to DNS problems.\n\r", 0);

			close(desc);
			free_descriptor(dnew);
			return;
		}

		if ((from = gethostbyaddr((char *)&sock.sin_addr, sizeof(sock.sin_addr), AF_INET)) != nullptr)
		{
			dnew->host = palloc_string(from->h_name);
			dnew->type = 0;
		}
		else
		{
			dnew->host = palloc_string(buf);
			dnew->type = 1;
		}
	}

	/*
	 * Swiftest: I added the following to ban sites.  I don't
	 * endorse banning of sites, but Copper has few descriptors now
	 * and some people from certain sites keep abusing access by
	 * using automated 'autodialers' and leaving connections hanging.
	 *
	 * Furey: added suffix check by request of Nickel of HiddenWorlds.
	 */
	if (check_ban(dnew->host, NBAN_ALL, dnew->type))
	{
		write_to_descriptor(desc, "Your site has been banned from this mud.\n\r", 0);

		close(desc);
		free_descriptor(dnew);
		return;
	}
	/*
	 * Init descriptor data.
	 */
	dnew->next = descriptor_list;
	descriptor_list = dnew;

	/*
	 * Send the greeting.
	 */
	{
		if (help_greeting[0] == '.')
			write_to_buffer(dnew, help_greeting + 1, 0);
		else
			write_to_buffer(dnew, help_greeting, 0);
	}
}